

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_schema_sort(lyd_node *sibling,int recursive)

{
  long *plVar1;
  uint uVar2;
  int iVar3;
  long *__ptr;
  lys_module *plVar4;
  lys_node *plVar5;
  lys_node *plVar6;
  lys_node *parent;
  lys_module *plVar7;
  lys_node *last;
  char *format;
  LY_ERR no;
  lyd_node *plVar8;
  long *plVar9;
  long *plVar10;
  long lVar11;
  ly_ctx *ctx;
  lys_node *next;
  ulong __nmemb;
  ulong uVar12;
  
  if (sibling == (lyd_node *)0x0) {
    format = "Invalid arguments (%s()).";
    ctx = (ly_ctx *)0x0;
    no = LY_EINVAL;
LAB_001695f7:
    ly_log(ctx,LY_LLERR,no,format,"lyd_schema_sort");
LAB_001695fe:
    iVar3 = -1;
  }
  else {
    if (sibling->prev != sibling) {
      plVar8 = sibling;
      if (sibling->parent == (lyd_node *)0x0) {
        do {
          sibling = plVar8;
          plVar8 = sibling->prev;
        } while (sibling->prev->next != (lyd_node *)0x0);
      }
      else {
        sibling = sibling->parent->child;
      }
      uVar2 = 0;
      for (plVar8 = sibling; plVar8 != (lyd_node *)0x0; plVar8 = plVar8->next) {
        uVar2 = uVar2 + 1;
      }
      __nmemb = (ulong)uVar2;
      __ptr = (long *)malloc(__nmemb << 4);
      if (__ptr == (long *)0x0) {
        ctx = sibling->schema->module->ctx;
        format = "Memory allocation failed (%s()).";
        no = LY_EMEM;
        goto LAB_001695f7;
      }
      if (__nmemb != 0) {
        uVar12 = 0;
        plVar5 = (lys_node *)0x0;
        plVar8 = sibling;
        do {
          *(undefined4 *)(__ptr + uVar12 * 2 + 1) = 0;
          if (plVar5 == (lys_node *)0x0) {
LAB_0016943c:
            plVar6 = plVar8->schema;
            while ((plVar5 = lys_parent(plVar6), plVar5 != (lys_node *)0x0 &&
                   (plVar5 = lys_parent(plVar6),
                   (plVar5->nodetype & (LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN))) {
              plVar6 = lys_parent(plVar6);
            }
            plVar5 = lys_parent(plVar6);
            if (plVar5 == (lys_node *)0x0) {
              do {
                plVar5 = plVar6;
                plVar6 = plVar5->prev;
              } while (plVar5->prev->next != (lys_node *)0x0);
            }
            else {
              plVar5 = lys_parent(plVar6);
              plVar5 = plVar5->child;
            }
          }
          else {
            if (plVar8 == (lyd_node *)0x0) {
              plVar7 = (lys_module *)0x0;
            }
            else {
              plVar7 = plVar8->schema->module;
              if ((plVar7->field_0x40 & 1) != 0) {
                plVar7 = (lys_module *)plVar7->data;
              }
            }
            plVar4 = lys_node_module(plVar5);
            if (plVar7 != plVar4) goto LAB_0016943c;
          }
          plVar9 = __ptr + uVar12 * 2;
          plVar6 = plVar8->schema;
          last = (lys_node *)0x0;
          do {
            parent = lys_parent(plVar5);
            plVar7 = lys_node_module(plVar5);
            last = lys_getnext(last,parent,plVar7,0x100);
            if (last == (lys_node *)0x0) {
              ly_log(plVar5->module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                     ,0x12e2);
              break;
            }
            *(int *)(plVar9 + 1) = (int)plVar9[1] + 1;
          } while (last != plVar6);
          if (last == (lys_node *)0x0) {
            free(__ptr);
            goto LAB_001695fe;
          }
          *plVar9 = (long)plVar8;
          uVar12 = uVar12 + 1;
          plVar8 = plVar8->next;
        } while (uVar12 != __nmemb);
      }
      qsort(__ptr,__nmemb,0x10,lyd_node_pos_cmp);
      if (__nmemb != 0) {
        uVar12 = 0;
        plVar9 = __ptr;
        do {
          if (uVar12 == 0) {
            sibling = (lyd_node *)*__ptr;
            if (sibling->parent != (lyd_node *)0x0) {
              sibling->parent->child = sibling;
            }
          }
          plVar10 = plVar9 + -2;
          plVar1 = plVar9;
          if (uVar12 == 0) {
            plVar10 = __ptr + (ulong)(uVar2 - 1) * 2;
            plVar1 = __ptr;
          }
          *(long *)(*plVar1 + 0x20) = *plVar10;
          if (uVar12 < uVar2 - 1) {
            lVar11 = plVar9[2];
          }
          else {
            lVar11 = 0;
          }
          *(long *)(*plVar9 + 0x18) = lVar11;
          uVar12 = uVar12 + 1;
          plVar9 = plVar9 + 2;
        } while (__nmemb != uVar12);
      }
      free(__ptr);
    }
    iVar3 = 0;
    if (recursive != 0) {
      for (; iVar3 = 0, sibling != (lyd_node *)0x0; sibling = sibling->next) {
        if ((((sibling->schema->nodetype & (LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER)) !=
              LYS_UNKNOWN) && (sibling->child != (lyd_node *)0x0)) &&
           (iVar3 = lyd_schema_sort(sibling->child,recursive), iVar3 != 0)) goto LAB_001695fe;
      }
    }
  }
  return iVar3;
}

Assistant:

API int
lyd_schema_sort(struct lyd_node *sibling, int recursive)
{
    uint32_t len, i;
    struct lyd_node *node;
    struct lys_node *first_ssibling = NULL;
    struct lyd_node_pos *array;

    if (!sibling) {
        LOGARG;
        return -1;
    }

    /* something actually to sort */
    if (sibling->prev != sibling) {

        /* find the beginning */
        sibling = lyd_first_sibling(sibling);

        /* count siblings */
        len = 0;
        for (node = sibling; node; node = node->next) {
            ++len;
        }

        array = malloc(len * sizeof *array);
        LY_CHECK_ERR_RETURN(!array, LOGMEM(sibling->schema->module->ctx), -1);

        /* fill arrays with positions and corresponding nodes */
        for (i = 0, node = sibling; i < len; ++i, node = node->next) {
            array[i].pos = 0;

            /* we need to repeat this for every module */
            if (!first_ssibling || (lyd_node_module(node) != lys_node_module(first_ssibling))) {
                /* find the data node schema parent */
                first_ssibling = node->schema;
                while (lys_parent(first_ssibling)
                        && (lys_parent(first_ssibling)->nodetype & (LYS_CHOICE | LYS_CASE | LYS_USES))) {
                    first_ssibling = lys_parent(first_ssibling);
                }

                /* find the beginning */
                if (lys_parent(first_ssibling)) {
                    first_ssibling = lys_parent(first_ssibling)->child;
                } else {
                    while (first_ssibling->prev->next) {
                        first_ssibling = first_ssibling->prev;
                    }
                }
            }

            if (lys_module_node_pos_r(first_ssibling, node->schema, &array[i].pos)) {
                free(array);
                return -1;
            }

            array[i].node = node;
        }

        /* sort the arrays */
        qsort(array, len, sizeof *array, lyd_node_pos_cmp);

        /* adjust siblings based on the sorted array */
        for (i = 0; i < len; ++i) {
            /* parent child */
            if (i == 0) {
                /* adjust sibling so that it still points to the beginning */
                sibling = array[i].node;
                if (array[i].node->parent) {
                    array[i].node->parent->child = array[i].node;
                }
            }

            /* prev */
            if (i > 0) {
                array[i].node->prev = array[i - 1].node;
            } else {
                array[i].node->prev = array[len - 1].node;
            }

            /* next */
            if (i < len - 1) {
                array[i].node->next = array[i + 1].node;
            } else {
                array[i].node->next = NULL;
            }
        }
        free(array);
    }

    /* sort all the children recursively */
    if (recursive) {
        LY_TREE_FOR(sibling, node) {
            if ((node->schema->nodetype & (LYS_CONTAINER | LYS_LIST | LYS_RPC | LYS_ACTION | LYS_NOTIF))
                    && node->child && lyd_schema_sort(node->child, recursive)) {
                return -1;
            }
        }
    }

    return EXIT_SUCCESS;
}